

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::small_vector
          (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this,allocator<double> *alloc)

{
  double *pdVar1;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *in_RDI;
  allocator<double> *in_stack_ffffffffffffffc8;
  
  std::allocator<double>::allocator((allocator<double> *)in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->m_capacity = 4;
  in_RDI->m_dynamic_capacity = 0;
  in_RDI->m_dynamic_data = (pointer)0x0;
  pdVar1 = static_begin_ptr(in_RDI);
  in_RDI->m_end = pdVar1;
  in_RDI->m_begin = pdVar1;
  return;
}

Assistant:

small_vector(const Alloc& alloc)
        : m_alloc(alloc)
        , m_capacity(StaticCapacity)
        , m_dynamic_capacity(0)
        , m_dynamic_data(nullptr)
    {
        m_begin = m_end = static_begin_ptr();
    }